

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_ldm_gear_feed(ldmRollingHashState_t *state,BYTE *data,size_t size,size_t *splits,
                         uint *numSplits)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  U64 UVar5;
  size_t sVar6;
  
  UVar5 = state->rolling;
  uVar1 = state->stopMask;
  if (size < 4) {
    uVar2 = 0;
  }
  else {
    sVar3 = 2;
    do {
      sVar6 = sVar3;
      UVar5 = UVar5 * 2 + ZSTD_ldm_gearTab[data[sVar6 - 2]];
      if ((UVar5 & uVar1) == 0) {
        uVar4 = *numSplits;
        splits[uVar4] = sVar6 - 1;
        uVar4 = uVar4 + 1;
        *numSplits = uVar4;
        sVar3 = sVar6 - 1;
        if (uVar4 == 0x40) goto LAB_00171b18;
      }
      UVar5 = UVar5 * 2 + ZSTD_ldm_gearTab[data[sVar6 - 1]];
      if ((UVar5 & uVar1) == 0) {
        uVar4 = *numSplits;
        splits[uVar4] = sVar6;
        uVar4 = uVar4 + 1;
        *numSplits = uVar4;
        sVar3 = sVar6;
        if (uVar4 == 0x40) goto LAB_00171b18;
      }
      UVar5 = UVar5 * 2 + ZSTD_ldm_gearTab[data[sVar6]];
      if ((UVar5 & uVar1) == 0) {
        sVar3 = sVar6 + 1;
        uVar4 = *numSplits;
        splits[uVar4] = sVar3;
        uVar4 = uVar4 + 1;
        *numSplits = uVar4;
        if (uVar4 == 0x40) goto LAB_00171b18;
      }
      UVar5 = UVar5 * 2 + ZSTD_ldm_gearTab[data[sVar6 + 1]];
      if ((UVar5 & uVar1) == 0) {
        sVar3 = sVar6 + 2;
        uVar4 = *numSplits;
        splits[uVar4] = sVar3;
        uVar4 = uVar4 + 1;
        *numSplits = uVar4;
        if (uVar4 == 0x40) goto LAB_00171b18;
      }
      sVar3 = sVar6 + 4;
    } while (sVar6 + 5 < size);
    uVar2 = sVar6 + 2;
  }
  do {
    do {
      sVar3 = uVar2;
      if (size <= uVar2) goto LAB_00171b18;
      sVar3 = uVar2 + 1;
      UVar5 = UVar5 * 2 + ZSTD_ldm_gearTab[data[uVar2]];
      uVar2 = sVar3;
    } while ((UVar5 & uVar1) != 0);
    uVar4 = *numSplits;
    splits[uVar4] = sVar3;
    uVar4 = uVar4 + 1;
    *numSplits = uVar4;
  } while (uVar4 != 0x40);
LAB_00171b18:
  state->rolling = UVar5;
  return sVar3;
}

Assistant:

static size_t ZSTD_ldm_gear_feed(ldmRollingHashState_t* state,
                                 BYTE const* data, size_t size,
                                 size_t* splits, unsigned* numSplits)
{
    size_t n;
    U64 hash, mask;

    hash = state->rolling;
    mask = state->stopMask;
    n = 0;

#define GEAR_ITER_ONCE() do { \
        hash = (hash << 1) + ZSTD_ldm_gearTab[data[n] & 0xff]; \
        n += 1; \
        if (UNLIKELY((hash & mask) == 0)) { \
            splits[*numSplits] = n; \
            *numSplits += 1; \
            if (*numSplits == LDM_BATCH_SIZE) \
                goto done; \
        } \
    } while (0)

    while (n + 3 < size) {
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
    }
    while (n < size) {
        GEAR_ITER_ONCE();
    }

#undef GEAR_ITER_ONCE

done:
    state->rolling = hash;
    return n;
}